

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTable
          (BinaryReaderInterp *this,Index index,Type elem_type,Limits *elem_limits)

{
  undefined4 uVar1;
  Offset OVar2;
  char *pcVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  Result RVar6;
  Enum EVar7;
  Location loc;
  undefined1 local_78 [32];
  undefined3 uStack_58;
  undefined4 uStack_55;
  undefined1 uStack_51;
  bool local_50;
  bool local_4f;
  bool bStack_4e;
  undefined1 uStack_4d;
  undefined1 local_4c;
  undefined3 uStack_4b;
  undefined1 local_48 [27];
  undefined1 uStack_2d;
  undefined7 uStack_2c;
  undefined4 local_25;
  undefined1 local_21;
  bool local_20;
  bool local_1f;
  bool bStack_1e;
  
  local_78._24_4_ = 0;
  local_78._0_8_ = (this->filename_)._M_len;
  pcVar3 = (this->filename_)._M_str;
  local_78._8_4_ = SUB84(pcVar3,0);
  local_78._12_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_78._16_4_ = (undefined4)OVar2;
  local_78._20_4_ = (undefined4)(OVar2 >> 0x20);
  RVar6 = SharedValidator::OnTable(&this->validator_,(Location *)local_78,elem_type,elem_limits);
  EVar7 = Error;
  if (RVar6.enum_ != Error) {
    uVar4 = elem_limits->initial;
    uVar5 = elem_limits->max;
    local_78._24_4_ = (undefined4)uVar4;
    local_78._28_4_ = (undefined4)(uVar4 >> 0x20);
    uStack_58 = (undefined3)uVar5;
    uStack_55 = (undefined4)(uVar5 >> 0x18);
    uStack_51 = (undefined1)(uVar5 >> 0x38);
    local_50 = elem_limits->has_max;
    local_78._8_4_ = Table;
    local_78._0_8_ = &PTR__ExternType_002258c0;
    local_78._12_4_ = elem_type.enum_;
    local_78._16_4_ = elem_type.type_index_;
    uVar1._0_1_ = elem_limits->is_shared;
    uVar1._1_1_ = elem_limits->is_64;
    uVar1._2_2_ = *(undefined2 *)&elem_limits->field_0x13;
    _local_4f = (undefined2)uVar1;
    uStack_4d = (undefined1)uVar1._2_2_;
    uStack_4b = (undefined3)((uint)*(undefined4 *)&elem_limits->field_0x14 >> 8);
    local_4c = (undefined1)((ushort)uVar1._2_2_ >> 8);
    if ((local_50 & 1U) == 0) {
      uStack_58 = 0xffffff;
      uStack_55 = 0xff;
      uStack_51 = 0;
    }
    local_48._8_4_ = Table;
    local_48._0_8_ = &PTR__ExternType_002258c0;
    local_48._20_7_ = (undefined7)CONCAT44(local_78._24_4_,local_78._20_4_);
    uStack_2d = (undefined1)(uVar4 >> 0x18);
    uStack_2c = (undefined7)(CONCAT35(uStack_58,(int5)(uVar4 >> 0x18)) >> 8);
    local_25 = uStack_55;
    local_21 = uStack_51;
    local_1f = local_4f;
    bStack_1e = bStack_4e;
    local_48._12_8_ = elem_type;
    local_20 = local_50;
    std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::
    emplace_back<wabt::interp::TableDesc>(&this->module_->tables,(TableDesc *)local_48);
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,(value_type *)local_78);
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReaderInterp::OnTable(Index index,
                                   Type elem_type,
                                   const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(GetLocation(), elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.tables.push_back(TableDesc{table_type});
  table_types_.push_back(table_type);
  return Result::Ok;
}